

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_runtime.h
# Opt level: O0

void __thiscall tvm::runtime::GraphRuntime::Load(GraphRuntime *this,JSONReader *reader)

{
  bool bVar1;
  ostringstream *poVar2;
  ostream *poVar3;
  LogMessageFatal local_368;
  LogCheckError local_1e0;
  LogCheckError _check_err;
  undefined1 local_40 [8];
  string key;
  int bitmask;
  JSONReader *reader_local;
  GraphRuntime *this_local;
  
  dmlc::JSONReader::BeginObject(reader);
  key.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_40);
  while (bVar1 = dmlc::JSONReader::NextObjectItem(reader,(string *)local_40), bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"nodes");
    if (bVar1) {
      dmlc::JSONReader::
      Read<std::vector<tvm::runtime::GraphRuntime::Node,std::allocator<tvm::runtime::GraphRuntime::Node>>>
                (reader,&this->nodes_);
      key.field_2._12_4_ = key.field_2._12_4_ | 1;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"arg_nodes");
      if (bVar1) {
        dmlc::JSONReader::Read<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  (reader,&this->input_nodes_);
        key.field_2._12_4_ = key.field_2._12_4_ | 2;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"node_row_ptr");
        if (bVar1) {
          dmlc::JSONReader::Read<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    (reader,&this->node_row_ptr_);
          key.field_2._12_4_ = key.field_2._12_4_ | 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"heads");
          if (bVar1) {
            dmlc::JSONReader::
            Read<std::vector<tvm::runtime::GraphRuntime::NodeEntry,std::allocator<tvm::runtime::GraphRuntime::NodeEntry>>>
                      (reader,&this->outputs_);
            key.field_2._12_4_ = key.field_2._12_4_ | 8;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40,"attrs");
            if (bVar1) {
              dmlc::JSONReader::Read<tvm::runtime::GraphRuntime::GraphAttr>(reader,&this->attrs_);
              key.field_2._12_4_ = key.field_2._12_4_ | 0x10;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_40,"metadata");
              if (bVar1) break;
              dmlc::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&_check_err,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.h"
                         ,0x167);
              poVar2 = dmlc::LogMessageFatal::stream_abi_cxx11_((LogMessageFatal *)&_check_err);
              poVar3 = std::operator<<((ostream *)poVar2,"key ");
              poVar3 = std::operator<<(poVar3,(string *)local_40);
              std::operator<<(poVar3," is not supported");
              dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&_check_err);
            }
          }
        }
      }
    }
  }
  dmlc::LogCheck_EQ((dmlc *)&local_1e0,key.field_2._12_4_,0x1f);
  bVar1 = dmlc::LogCheckError::operator_cast_to_bool(&local_1e0);
  if (bVar1) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_368,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.h"
               ,0x16a);
    poVar2 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_368);
    poVar3 = std::operator<<((ostream *)poVar2,"Check failed: ");
    poVar3 = std::operator<<(poVar3,"bitmask == 1 | 2 | 4 | 8 | 16");
    poVar3 = std::operator<<(poVar3,(string *)local_1e0.str);
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"invalid format");
    dmlc::LogMessageFatal::~LogMessageFatal(&local_368);
  }
  dmlc::LogCheckError::~LogCheckError(&local_1e0);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Load(dmlc::JSONReader *reader) {
    reader->BeginObject();
    int bitmask = 0;
    std::string key;
    while (reader->NextObjectItem(&key)) {
      if (key == "nodes") {
        reader->Read(&nodes_);
        bitmask |= 1;
      } else if (key == "arg_nodes") {
        reader->Read(&input_nodes_);
        bitmask |= 2;
      } else if (key == "node_row_ptr") {
        reader->Read(&node_row_ptr_);
        bitmask |= 4;
      } else if (key == "heads") {
        reader->Read(&outputs_);
        bitmask |= 8;
      } else if (key == "attrs") {
        reader->Read(&attrs_);
        bitmask |= 16;
      } else if (key == "metadata") {
        break;
      } else {
        LOG(FATAL) << "key " << key << " is not supported";
      }
    }
    CHECK_EQ(bitmask, 1 | 2 | 4 | 8 | 16) << "invalid format";
  }